

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_highbd_quantize_sse4.c
# Opt level: O2

void quantize_coeff_phase2
               (__m128i *qcoeff,__m128i *dquan,__m128i *sign,__m128i *param,int shift,int scale,
               tran_low_t *qAddr,tran_low_t *dqAddr)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  longlong lVar9;
  undefined1 auVar10 [16];
  __m128i alVar11;
  undefined1 auVar12 [16];
  
  auVar10 = pmuldq((undefined1  [16])param[1],(undefined1  [16])qcoeff[1]);
  alVar11[0] = auVar10._0_8_ >> (ulong)(uint)shift;
  alVar11[1] = auVar10._8_8_ >> (ulong)(uint)shift;
  qcoeff[1] = alVar11;
  auVar10 = pmuldq((undefined1  [16])alVar11,(undefined1  [16])param[2]);
  dquan[1][0] = auVar10._0_8_ >> (ulong)(uint)scale;
  dquan[1][1] = auVar10._8_8_ >> (ulong)(uint)scale;
  auVar10._8_4_ = (int)qcoeff[1][0];
  auVar10._0_8_ = qcoeff[1][0];
  auVar10._12_4_ = (int)qcoeff[1][1];
  (*qcoeff)[0] = CONCAT44((int)(*qcoeff)[1],(int)(*qcoeff)[0]);
  (*qcoeff)[1] = 0;
  alVar11 = (__m128i)pblendw(auVar10,(undefined1  [16])0x0,0xf);
  qcoeff[1] = alVar11;
  auVar12._8_4_ = (int)dquan[1][0];
  auVar12._0_8_ = dquan[1][0];
  auVar12._12_4_ = (int)dquan[1][1];
  (*dquan)[0] = CONCAT44((int)(*dquan)[1],(int)(*dquan)[0]);
  (*dquan)[1] = 0;
  alVar11 = (__m128i)pblendw(auVar12,(undefined1  [16])0x0,0xf);
  dquan[1] = alVar11;
  uVar7 = qcoeff[1][1];
  uVar8 = (*qcoeff)[1];
  (*qcoeff)[0] = qcoeff[1][0] | (*qcoeff)[0];
  (*qcoeff)[1] = uVar7 | uVar8;
  uVar7 = dquan[1][1];
  uVar8 = (*dquan)[1];
  (*dquan)[0] = dquan[1][0] | (*dquan)[0];
  (*dquan)[1] = uVar7 | uVar8;
  alVar11 = (__m128i)psignd((undefined1  [16])*qcoeff,(undefined1  [16])*sign);
  *qcoeff = alVar11;
  alVar11 = (__m128i)psignd((undefined1  [16])*dquan,(undefined1  [16])*sign);
  *dquan = alVar11;
  uVar1 = (uint)qcoeff[2][0];
  uVar2 = *(uint *)((long)qcoeff[2] + 4);
  uVar3 = (uint)qcoeff[2][1];
  uVar4 = *(uint *)((long)qcoeff[2] + 0xc);
  uVar5 = *(uint *)((long)*qcoeff + 4);
  lVar9 = (*qcoeff)[1];
  uVar6 = *(uint *)((long)*qcoeff + 0xc);
  *(uint *)*qcoeff = ~uVar1 & (uint)(*qcoeff)[0];
  *(uint *)((long)*qcoeff + 4) = ~uVar2 & uVar5;
  *(uint *)(*qcoeff + 1) = ~uVar3 & (uint)lVar9;
  *(uint *)((long)*qcoeff + 0xc) = ~uVar4 & uVar6;
  uVar5 = *(uint *)((long)*dquan + 4);
  lVar9 = (*dquan)[1];
  uVar6 = *(uint *)((long)*dquan + 0xc);
  *(uint *)*dquan = ~uVar1 & (uint)(*dquan)[0];
  *(uint *)((long)*dquan + 4) = ~uVar2 & uVar5;
  *(uint *)(*dquan + 1) = ~uVar3 & (uint)lVar9;
  *(uint *)((long)*dquan + 0xc) = ~uVar4 & uVar6;
  lVar9 = (*qcoeff)[1];
  *(longlong *)qAddr = (*qcoeff)[0];
  *(longlong *)(qAddr + 2) = lVar9;
  lVar9 = (*dquan)[1];
  *(longlong *)dqAddr = (*dquan)[0];
  *(longlong *)(dqAddr + 2) = lVar9;
  return;
}

Assistant:

static inline void quantize_coeff_phase2(__m128i *qcoeff, __m128i *dquan,
                                         const __m128i *sign,
                                         const __m128i *param, const int shift,
                                         const int scale, tran_low_t *qAddr,
                                         tran_low_t *dqAddr) {
  __m128i mask0L = _mm_set_epi32(-1, -1, 0, 0);
  __m128i mask0H = _mm_set_epi32(0, 0, -1, -1);

  qcoeff[1] = _mm_mul_epi32(qcoeff[1], param[1]);
  qcoeff[1] = _mm_srli_epi64(qcoeff[1], shift);
  dquan[1] = _mm_mul_epi32(qcoeff[1], param[2]);
  dquan[1] = _mm_srli_epi64(dquan[1], scale);

  // combine L&H
  qcoeff[0] = _mm_shuffle_epi32(qcoeff[0], 0xd8);
  qcoeff[1] = _mm_shuffle_epi32(qcoeff[1], 0x8d);

  qcoeff[0] = _mm_and_si128(qcoeff[0], mask0H);
  qcoeff[1] = _mm_and_si128(qcoeff[1], mask0L);

  dquan[0] = _mm_shuffle_epi32(dquan[0], 0xd8);
  dquan[1] = _mm_shuffle_epi32(dquan[1], 0x8d);

  dquan[0] = _mm_and_si128(dquan[0], mask0H);
  dquan[1] = _mm_and_si128(dquan[1], mask0L);

  qcoeff[0] = _mm_or_si128(qcoeff[0], qcoeff[1]);
  dquan[0] = _mm_or_si128(dquan[0], dquan[1]);

  qcoeff[0] = _mm_sign_epi32(qcoeff[0], *sign);
  dquan[0] = _mm_sign_epi32(dquan[0], *sign);
  qcoeff[0] = _mm_andnot_si128(qcoeff[2], qcoeff[0]);
  dquan[0] = _mm_andnot_si128(qcoeff[2], dquan[0]);
  _mm_storeu_si128((__m128i *)qAddr, qcoeff[0]);
  _mm_storeu_si128((__m128i *)dqAddr, dquan[0]);
}